

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::indexOfElementWithNextUnit
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,UChar unit)

{
  UChar UVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = i + -1;
  lVar3 = (long)i << 3;
  do {
    UVar1 = UCharsTrieElement::charAt
                      ((UCharsTrieElement *)((long)&this->elements->stringOffset + lVar3),unitIndex,
                       &this->strings);
    iVar2 = iVar2 + 1;
    lVar3 = lVar3 + 8;
  } while (UVar1 == unit);
  return iVar2;
}

Assistant:

int32_t
UCharsTrieBuilder::indexOfElementWithNextUnit(int32_t i, int32_t unitIndex, UChar unit) const {
    while(unit==elements[i].charAt(unitIndex, strings)) {
        ++i;
    }
    return i;
}